

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

Hop_Man_t * Abc_NtkPartStartHop(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  undefined8 *puVar4;
  long lVar5;
  long *plVar6;
  int iVar7;
  Hop_Man_t *p;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  Abc_Obj_t *pAVar10;
  Hop_Obj_t *pHVar11;
  char *__assertion;
  long lVar12;
  
  ppvVar9 = (void **)0x0;
  p = Hop_ManStart();
  uVar1 = pNtk->vObjs->nSize;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < uVar1) {
    iVar7 = uVar1 + 1;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = iVar7;
  if (iVar7 != 0) {
    ppvVar9 = (void **)malloc((long)iVar7 << 3);
  }
  pVVar8->pArray = ppvVar9;
  p->vObjs = pVVar8;
  pHVar11 = p->pConst1;
  if (iVar7 == 0) {
    if (ppvVar9 == (void **)0x0) {
      ppvVar9 = (void **)malloc(0x80);
    }
    else {
      ppvVar9 = (void **)realloc(ppvVar9,0x80);
    }
    pVVar8->pArray = ppvVar9;
    pVVar8->nCap = 0x10;
  }
  pVVar8->nSize = 1;
  *pVVar8->pArray = pHVar11;
  pAVar2 = (Abc_Obj_t *)p->pConst1;
  pAVar10 = Abc_AigConst1(pNtk);
  pAVar10->pNext = pAVar2;
  pVVar8 = pNtk->vCis;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      pvVar3 = pVVar8->pArray[lVar12];
      pHVar11 = Hop_ObjCreatePi(p);
      *(Hop_Obj_t **)((long)pvVar3 + 8) = pHVar11;
      lVar12 = lVar12 + 1;
      pVVar8 = pNtk->vCis;
    } while (lVar12 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      puVar4 = (undefined8 *)pVVar8->pArray[lVar12];
      if (puVar4 != (undefined8 *)0x0) {
        if (((ulong)puVar4 & 1) != 0) goto LAB_002ea2a5;
        if (*(int *)*puVar4 != 3) goto LAB_002ea29c;
        if (*(int *)((long)puVar4 + 0x1c) == 2) {
          lVar5 = *(long *)(*(long *)((int *)*puVar4 + 8) + 8);
          pHVar11 = Hop_And(p,(Hop_Obj_t *)
                              ((ulong)(*(uint *)((long)puVar4 + 0x14) >> 10 & 1) ^
                              *(ulong *)(*(long *)(lVar5 + (long)*(int *)puVar4[4] * 8) + 8)),
                            (Hop_Obj_t *)
                            ((ulong)(*(uint *)((long)puVar4 + 0x14) >> 0xb & 1) ^
                            *(ulong *)(*(long *)(lVar5 + (long)((int *)puVar4[4])[1] * 8) + 8)));
          puVar4[1] = pHVar11;
          if (((ulong)pHVar11 & 1) != 0) {
            __assert_fail("!Abc_ObjIsComplement(pObj->pNext)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                          ,0x3cc,"Hop_Man_t *Abc_NtkPartStartHop(Abc_Ntk_t *)");
          }
        }
      }
      lVar12 = lVar12 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar12 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      puVar4 = (undefined8 *)pVVar8->pArray[lVar12];
      if (puVar4 != (undefined8 *)0x0) {
        if (((ulong)puVar4 & 1) != 0) goto LAB_002ea2a5;
        if (*(int *)*puVar4 != 3) goto LAB_002ea29c;
        if ((*(int *)((long)puVar4 + 0x1c) == 2) && (puVar4[8] != 0)) {
          *(undefined8 *)puVar4[1] = *(undefined8 *)(puVar4[8] + 8);
        }
      }
      lVar12 = lVar12 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar12 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      plVar6 = (long *)pVVar8->pArray[lVar12];
      Hop_ObjCreatePo(p,(Hop_Obj_t *)
                        ((ulong)(*(uint *)((long)plVar6 + 0x14) >> 10 & 1) ^
                        *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                            (long)*(int *)plVar6[4] * 8) + 8)));
      lVar12 = lVar12 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar12 < pVVar8->nSize);
  }
  iVar7 = Hop_ManCheck(p);
  if (iVar7 == 0) {
    puts("Abc_NtkPartStartHop: HOP manager check has failed.");
  }
  return p;
LAB_002ea2a5:
  __assertion = "!Abc_ObjIsComplement(pNode)";
  goto LAB_002ea2ac;
LAB_002ea29c:
  __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
LAB_002ea2ac:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
}

Assistant:

Hop_Man_t * Abc_NtkPartStartHop( Abc_Ntk_t * pNtk )
{
    Hop_Man_t * pMan;
    Abc_Obj_t * pObj;
    int i;
    // start the HOP package
    pMan = Hop_ManStart();
    pMan->vObjs = Vec_PtrAlloc( Abc_NtkObjNumMax(pNtk) + 1  );
    Vec_PtrPush( pMan->vObjs, Hop_ManConst1(pMan) );
    // map constant node and PIs
    Abc_AigConst1(pNtk)->pNext = (Abc_Obj_t *)Hop_ManConst1(pMan);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)Hop_ObjCreatePi(pMan);
    // map the internal nodes
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        pObj->pNext = (Abc_Obj_t *)Hop_And( pMan, Hop_ObjChild0Next(pObj), Hop_ObjChild1Next(pObj) );
        assert( !Abc_ObjIsComplement(pObj->pNext) );
    }
    // set the choice nodes
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        if ( pObj->pCopy )
            ((Hop_Obj_t *)pObj->pNext)->pData = pObj->pCopy->pNext;
    }
    // transfer the POs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Hop_ObjCreatePo( pMan, Hop_ObjChild0Next(pObj) );
    // check the new manager
    if ( !Hop_ManCheck(pMan) )
        printf( "Abc_NtkPartStartHop: HOP manager check has failed.\n" );
    return pMan;
}